

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  GCstr *pGVar1;
  TValue *pTVar2;
  uint uVar3;
  CTSize CVar4;
  CPToken CVar5;
  int iVar6;
  GCstr *pGVar7;
  uint uVar8;
  char cVar9;
  int iVar10;
  bool bVar11;
  
LAB_0014eccb:
  switch(cp->tok) {
  case 0x118:
    uVar3 = decl->attr;
    uVar8 = 0x2000000;
    break;
  case 0x119:
    uVar3 = decl->attr;
    uVar8 = 0x1000000;
    break;
  case 0x11a:
  case 0x121:
  case 0x125:
    goto switchD_0014ece7_caseD_11a;
  default:
    goto switchD_0014ece7_caseD_11b;
  case 0x122:
    cp_next(cp);
    cp_check(cp,0x28);
    if (cp->tok == 0x101) {
      pGVar7 = cp->str;
      while (CVar5 = cp_next(cp), CVar5 == 0x101) {
        lj_strfmt_pushf(cp->L,"%s%s",pGVar7 + 1,cp->str + 1);
        pTVar2 = cp->L->top;
        cp->L->top = pTVar2 + -1;
        pGVar7 = (GCstr *)(ulong)pTVar2[-1].u32.lo;
      }
      decl->redir = pGVar7;
    }
    goto LAB_0014f082;
  case 0x123:
    cp_next(cp);
    cp_check(cp,0x28);
    cp_check(cp,0x28);
    do {
      iVar6 = cp->tok;
      if (iVar6 == 0x100) {
        pGVar7 = cp->str;
        uVar3 = pGVar7->len;
        if (((((0xc < uVar3) && ((char)pGVar7[1].nextgc.gcptr32 == '_')) &&
             (*(char *)((long)&pGVar7[1].nextgc.gcptr32 + 1) == '_')) &&
            ((*(char *)((long)&pGVar7[1].nextgc.gcptr32 + 2) != '_' &&
             (*(char *)((long)&pGVar7[1].nextgc.gcptr32 + (ulong)(uVar3 - 2)) == '_')))) &&
           (*(char *)((long)&pGVar7[1].nextgc.gcptr32 + (ulong)(uVar3 - 1)) == '_')) {
          pGVar7 = lj_str_new(cp->L,(char *)((long)&pGVar7[1].nextgc.gcptr32 + 2),(ulong)(uVar3 - 4)
                             );
        }
        cp_next(cp);
        iVar6 = lj_cparse_case(pGVar7,
                               "\aaligned\v__aligned__\x06packed\n__packed__\x04mode\b__mode__\vvector_size\x0f__vector_size__"
                              );
        switch(iVar6) {
        case 0:
        case 1:
          cp_decl_align(cp,decl);
          break;
        case 2:
        case 3:
          *(byte *)&decl->attr = (byte)decl->attr | 2;
          break;
        case 4:
        case 5:
          cp_check(cp,0x28);
          if (cp->tok != 0x100) goto LAB_0014ef5c;
          pGVar1 = cp->str;
          pGVar7 = pGVar1 + 1;
          cVar9 = (char)pGVar1[1].nextgc.gcptr32;
          if (cVar9 == '_') {
            bVar11 = *(char *)((long)&pGVar1[1].nextgc.gcptr32 + 1) == '_';
            if (bVar11) {
              pGVar7 = (GCstr *)((long)&pGVar1[1].nextgc.gcptr32 + 2);
            }
            cVar9 = *(char *)((long)&pGVar1[1].nextgc.gcptr32 + (ulong)bVar11 * 2);
          }
          iVar6 = 0;
          if (cVar9 == 'V') {
            iVar6 = *(char *)((long)&(pGVar7->nextgc).gcptr32 + 1) + -0x30;
            cVar9 = *(char *)((long)&(pGVar7->nextgc).gcptr32 + 2);
            if ((byte)(cVar9 - 0x30U) < 10) {
              iVar6 = (uint)(byte)(cVar9 - 0x30U) + iVar6 * 10;
              cVar9 = *(char *)((long)&(pGVar7->nextgc).gcptr32 + 3);
              pGVar7 = (GCstr *)((long)&(pGVar7->nextgc).gcptr32 + 3);
            }
            else {
              pGVar7 = (GCstr *)((long)&(pGVar7->nextgc).gcptr32 + 2);
            }
          }
          iVar10 = 1;
          switch(cVar9) {
          case 'O':
            iVar10 = 0x20;
            break;
          case 'P':
          case 'R':
            goto switchD_0014eef1_caseD_50;
          case 'Q':
            break;
          case 'S':
            iVar10 = 4;
            break;
          case 'T':
            iVar10 = 0x10;
            break;
          default:
            if (cVar9 == 'D') {
              iVar10 = 8;
            }
            else {
              if (cVar9 != 'H') goto switchD_0014eef1_caseD_50;
              iVar10 = 2;
            }
          }
          cVar9 = *(char *)((long)&(pGVar7->nextgc).gcptr32 + 1);
          if ((cVar9 == 'I') || (cVar9 == 'F')) {
            uVar3 = decl->attr;
            decl->attr = iVar10 << 8 | uVar3 & 0xffff00ff;
            if (iVar6 != 0) {
              uVar8 = 0x1f;
              if (iVar10 * iVar6 != 0) {
                for (; (uint)(iVar10 * iVar6) >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              decl->attr = ((~uVar8 & 0xf) << 4 | iVar10 << 8 | uVar3 & 0xffff000f) ^ 0xf0;
            }
          }
switchD_0014eef1_caseD_50:
          cp_next(cp);
          goto LAB_0014ef5c;
        case 6:
        case 7:
          CVar4 = cp_decl_sizeattr(cp);
          if (CVar4 != 0) {
            uVar3 = 0x1f;
            if (CVar4 != 0) {
              for (; CVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            decl->attr = ((~uVar3 & 0xf) << 4 | decl->attr & 0xffffff0f) ^ 0xf0;
          }
          break;
        default:
          goto switchD_0014ee18_default;
        }
      }
      else {
        if ((iVar6 == 0x29) || (iVar6 < 0x10d)) break;
        cp_next(cp);
switchD_0014ee18_default:
        iVar6 = cp_opt(cp,0x28);
        if (iVar6 == 0) goto LAB_0014ef67;
        while ((cp->tok != 0x29 && (cp->tok != 0x103))) {
          cp_next(cp);
        }
LAB_0014ef5c:
        cp_check(cp,0x29);
      }
LAB_0014ef67:
      iVar6 = cp_opt(cp,0x2c);
    } while (iVar6 != 0);
    cp_check(cp,0x29);
LAB_0014f082:
    cp_check(cp,0x29);
    goto LAB_0014eccb;
  case 0x124:
    cp_next(cp);
    CVar5 = 0x28;
    do {
      cp_check(cp,CVar5);
      do {
        while( true ) {
          if (cp->tok != 0x100) goto LAB_0014f082;
          pGVar7 = cp->str;
          cp_next(cp);
          if ((pGVar7->len != 5) || (iVar6 = bcmp(pGVar7 + 1,"align",5), iVar6 != 0)) break;
          cp_decl_align(cp,decl);
        }
        iVar6 = cp_opt(cp,0x28);
      } while (iVar6 == 0);
      while ((CVar5 = 0x29, cp->tok != 0x29 && (cp->tok != 0x103))) {
        cp_next(cp);
      }
    } while( true );
  case 0x126:
    uVar8 = decl->attr & 0xffff00ff;
    uVar3 = (cp->ct->size & 0xff) << 8;
  }
  decl->attr = uVar3 | uVar8;
switchD_0014ece7_caseD_11a:
  cp_next(cp);
  goto LAB_0014eccb;
switchD_0014ece7_caseD_11b:
  return;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}